

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O0

int readRawYUV(char *filename,uint32_t width,uint32_t height,uint8_t **YUV)

{
  FILE *__stream;
  ulong uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  size_t result;
  uint32_t size;
  FILE *fp;
  uint8_t **YUV_local;
  uint32_t height_local;
  uint32_t width_local;
  char *filename_local;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    perror("Error opening yuv image for read");
    filename_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    if ((int)uVar1 == width * height + (width + 1 & 0xfffffffe) * (height + 1 >> 1)) {
      fseek(__stream,0,0);
      puVar2 = (uint8_t *)malloc(uVar1 & 0xffffffff);
      *YUV = puVar2;
      sVar3 = fread(*YUV,1,uVar1 & 0xffffffff,__stream);
      if (sVar3 == (uVar1 & 0xffffffff)) {
        fclose(__stream);
        filename_local._4_4_ = 0;
      }
      else {
        perror("Error reading yuv image");
        fclose(__stream);
        filename_local._4_4_ = 3;
      }
    }
    else {
      fprintf(_stderr,"Wrong size of yuv image : %d bytes, expected %d bytes\n",uVar1 & 0xffffffff,
              (ulong)(width * height + (width + 1 & 0xfffffffe) * (height + 1 >> 1)));
      fclose(__stream);
      filename_local._4_4_ = 2;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int readRawYUV(const char *filename, uint32_t width, uint32_t height, uint8_t **YUV)
{
	FILE *fp = fopen(filename, "rb");
	if(!fp)
	{
		perror("Error opening yuv image for read");
		return 1;
	}
	
	// check file size
	fseek(fp, 0, SEEK_END);
	uint32_t size = ftell(fp);
	if(size!=(width*height + 2*((width+1)/2)*((height+1)/2)))
	{
		fprintf(stderr, "Wrong size of yuv image : %d bytes, expected %d bytes\n", size, (width*height + 2*((width+1)/2)*((height+1)/2)));
		fclose(fp);
		return 2;
	}
	fseek(fp, 0, SEEK_SET);
	
	*YUV = malloc(size);
	size_t result = fread(*YUV, 1, size, fp);
	if (result != size) {
		perror("Error reading yuv image");
		fclose(fp);
		return 3;
	}
	fclose(fp);
	return 0;
}